

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O3

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,long,duckdb::UnaryOperatorWrapper,duckdb::StringLengthOperator>
               (string_t *ldata,long *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  TemplatedValidityData<unsigned_long> *pTVar3;
  unsigned_long *puVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  buffer_ptr<ValidityBuffer> *local_48;
  unsigned_long *local_40;
  idx_t local_38;
  
  puVar4 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
  if (puVar4 == (unsigned_long *)0x0) {
    if (count != 0) {
      iVar5 = 0;
      do {
        if ((int)*(ulong *)&ldata[iVar5].value == 0) {
          lVar12 = 0;
        }
        else {
          uVar8 = 0;
          lVar12 = 0;
          do {
            lVar12 = lVar12 + 1;
            uVar8 = uVar8 + 1;
          } while ((*(ulong *)&ldata[iVar5].value & 0xffffffff) != uVar8);
        }
        result_data[iVar5] = lVar12;
        iVar5 = iVar5 + 1;
      } while (iVar5 != count);
    }
  }
  else {
    if (adds_nulls) {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity = count;
      local_38 = count;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long*const&,unsigned_long&>
                ((duckdb *)&local_58,(unsigned_long **)mask,&local_38);
      p_Var2 = p_Stack_50;
      peVar1 = local_58;
      local_48 = &(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data;
      local_58 = (element_type *)0x0;
      p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this = (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
             super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar1;
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var2;
      if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
         p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
      }
      pTVar3 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->(local_48);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
           (unsigned_long *)
           (pTVar3->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>;
    }
    else {
      (result_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask = puVar4;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result_mask->super_TemplatedValidityMask<unsigned_long>).validity_data,
                 &(mask->super_TemplatedValidityMask<unsigned_long>).validity_data);
      (result_mask->super_TemplatedValidityMask<unsigned_long>).capacity =
           (mask->super_TemplatedValidityMask<unsigned_long>).capacity;
    }
    if (0x3f < count + 0x3f) {
      local_48 = (buffer_ptr<ValidityBuffer> *)(count + 0x3f >> 6);
      local_40 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      uVar7 = 0;
      puVar4 = local_40;
      uVar8 = 0;
      do {
        if (puVar4 == (unsigned_long *)0x0) {
          uVar9 = uVar8 + 0x40;
          if (count <= uVar8 + 0x40) {
            uVar9 = count;
          }
LAB_014d79ca:
          uVar6 = uVar8;
          if (uVar8 < uVar9) {
            do {
              p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                           ldata[uVar8].value.pointer.ptr;
              if ((int)*(ulong *)&ldata[uVar8].value == 0) {
                lVar12 = 0;
              }
              else {
                uVar11 = 0;
                lVar12 = 0;
                do {
                  lVar12 = lVar12 + 1;
                  uVar11 = uVar11 + 1;
                } while ((*(ulong *)&ldata[uVar8].value & 0xffffffff) != uVar11);
              }
              result_data[uVar8] = lVar12;
              uVar8 = uVar8 + 1;
              uVar6 = uVar9;
            } while (uVar8 != uVar9);
          }
        }
        else {
          uVar11 = puVar4[uVar7];
          uVar9 = uVar8 + 0x40;
          if (count <= uVar8 + 0x40) {
            uVar9 = count;
          }
          uVar6 = uVar9;
          if (uVar11 != 0) {
            if (uVar11 == 0xffffffffffffffff) goto LAB_014d79ca;
            uVar6 = uVar8;
            uVar10 = uVar8;
            if (uVar8 < uVar9) {
              do {
                if ((uVar11 >> ((ulong)(uint)((int)uVar10 - (int)uVar8) & 0x3f) & 1) != 0) {
                  if ((int)*(ulong *)&ldata[uVar10].value == 0) {
                    lVar12 = 0;
                  }
                  else {
                    uVar6 = 0;
                    lVar12 = 0;
                    do {
                      lVar12 = lVar12 + 1;
                      uVar6 = uVar6 + 1;
                    } while ((*(ulong *)&ldata[uVar10].value & 0xffffffff) != uVar6);
                  }
                  result_data[uVar10] = lVar12;
                }
                uVar10 = uVar10 + 1;
                uVar6 = uVar9;
              } while (uVar10 != uVar9);
            }
          }
        }
        uVar7 = uVar7 + 1;
        puVar4 = local_40;
        uVar8 = uVar6;
      } while ((buffer_ptr<ValidityBuffer> *)uVar7 != local_48);
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}